

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.cpp
# Opt level: O3

void duckdb::RepeatFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  long *plVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  reference vector;
  reference vector_00;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  idx_t iVar16;
  long lVar17;
  idx_t iVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ValidityMask *in_R8;
  idx_t in_R9;
  idx_t idx_in_entry;
  ulong uVar23;
  ulong uVar24;
  data_ptr_t pdVar25;
  data_ptr_t pdVar26;
  data_ptr_t pdVar27;
  idx_t count;
  anon_struct_16_3_d7536bce_for_pointer aVar28;
  string_t sVar29;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  UnifiedVectorFormat ldata;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar4 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      aVar28 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,
                          *(long *)vector_00->data,in_R8,in_R9);
      paVar4->pointer = aVar28;
      return;
    }
  }
  else {
    count = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      plVar5 = (long *)vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar25 = vector->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar26 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          lVar19 = *plVar5;
          lVar17 = 8;
          do {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + lVar17);
            left_02.value._0_8_ = *(undefined8 *)(pdVar25 + lVar17 + -8);
            sVar29 = BinaryLambdaWrapper::
                     Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,lVar19,in_R8,in_R9);
            *(long *)(pdVar26 + lVar17 + -8) = sVar29.value._0_8_;
            *(long *)(pdVar26 + lVar17) = sVar29.value._8_8_;
            lVar17 = lVar17 + 0x10;
            count = count - 1;
          } while (count != 0);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar22 = 0;
        uVar21 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar13 = uVar21 + 0x40;
            if (count <= uVar21 + 0x40) {
              uVar13 = count;
            }
LAB_01c3c7ba:
            uVar11 = uVar21;
            if (uVar21 < uVar13) {
              lVar19 = *plVar5;
              uVar24 = uVar21 << 4 | 8;
              do {
                left_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar24);
                left_00.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar24 - 8));
                sVar29 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_00,lVar19,in_R8,in_R9);
                *(long *)(pdVar26 + (uVar24 - 8)) = sVar29.value._0_8_;
                *(long *)(pdVar26 + uVar24) = sVar29.value._8_8_;
                uVar21 = uVar21 + 1;
                uVar24 = uVar24 + 0x10;
                uVar11 = uVar13;
              } while (uVar13 != uVar21);
            }
          }
          else {
            uVar24 = puVar3[uVar22];
            uVar13 = uVar21 + 0x40;
            if (count <= uVar21 + 0x40) {
              uVar13 = count;
            }
            uVar11 = uVar13;
            if (uVar24 != 0) {
              if (uVar24 == 0xffffffffffffffff) goto LAB_01c3c7ba;
              uVar11 = uVar21;
              if (uVar21 < uVar13) {
                uVar20 = uVar21 << 4 | 8;
                uVar23 = 0;
                do {
                  if ((uVar24 >> (uVar23 & 0x3f) & 1) != 0) {
                    left.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar20);
                    left.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar20 - 8));
                    sVar29 = BinaryLambdaWrapper::
                             Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left,*plVar5,in_R8,in_R9);
                    *(long *)(pdVar26 + (uVar20 - 8)) = sVar29.value._0_8_;
                    *(long *)(pdVar26 + uVar20) = sVar29.value._8_8_;
                  }
                  uVar23 = uVar23 + 1;
                  uVar20 = uVar20 + 0x10;
                  uVar11 = uVar13;
                } while (uVar13 - uVar21 != uVar23);
              }
            }
          }
          uVar22 = uVar22 + 1;
          uVar21 = uVar11;
          if (uVar22 == count + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar25 = vector->data;
          pdVar26 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar27 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              lVar19 = 0;
              do {
                sVar29.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + lVar19 * 2 + 8);
                sVar29.value._0_8_ = *(undefined8 *)(pdVar25 + lVar19 * 2);
                sVar29 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,sVar29,
                                    *(long *)(pdVar26 + lVar19),in_R8,in_R9);
                *(long *)(pdVar27 + lVar19 * 2) = sVar29.value._0_8_;
                *(long *)(pdVar27 + lVar19 * 2 + 8) = sVar29.value._8_8_;
                lVar19 = lVar19 + 8;
                count = count - 1;
              } while (count != 0);
            }
          }
          else if (0x3f < count + 0x3f) {
            uVar22 = 0;
            uVar21 = 0;
            do {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar13 = uVar21 + 0x40;
                if (count <= uVar21 + 0x40) {
                  uVar13 = count;
                }
LAB_01c3cc91:
                uVar11 = uVar21;
                if (uVar21 < uVar13) {
                  uVar24 = uVar21 << 4 | 8;
                  do {
                    left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar24);
                    left_03.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar24 - 8));
                    sVar29 = BinaryLambdaWrapper::
                             Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left_03,
                                        *(long *)(pdVar26 + uVar21 * 8),in_R8,in_R9);
                    *(long *)(pdVar27 + (uVar24 - 8)) = sVar29.value._0_8_;
                    *(long *)(pdVar27 + uVar24) = sVar29.value._8_8_;
                    uVar21 = uVar21 + 1;
                    uVar24 = uVar24 + 0x10;
                    uVar11 = uVar13;
                  } while (uVar13 != uVar21);
                }
              }
              else {
                uVar24 = puVar3[uVar22];
                uVar13 = uVar21 + 0x40;
                if (count <= uVar21 + 0x40) {
                  uVar13 = count;
                }
                uVar11 = uVar13;
                if (uVar24 != 0) {
                  if (uVar24 == 0xffffffffffffffff) goto LAB_01c3cc91;
                  uVar11 = uVar21;
                  if (uVar21 < uVar13) {
                    uVar20 = uVar21 << 4 | 8;
                    uVar23 = 0;
                    do {
                      if ((uVar24 >> (uVar23 & 0x3f) & 1) != 0) {
                        left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar20);
                        left_04.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar20 - 8));
                        sVar29 = BinaryLambdaWrapper::
                                 Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                           ((anon_class_8_1_6971b95b)result,left_04,
                                            *(long *)(pdVar26 + uVar23 * 8 + uVar21 * 8),in_R8,in_R9
                                           );
                        *(long *)(pdVar27 + (uVar20 - 8)) = sVar29.value._0_8_;
                        *(long *)(pdVar27 + uVar20) = sVar29.value._8_8_;
                      }
                      uVar23 = uVar23 + 1;
                      uVar20 = uVar20 + 0x10;
                      uVar11 = uVar13;
                    } while (uVar13 - uVar21 != uVar23);
                  }
                }
              }
              uVar22 = uVar22 + 1;
              uVar21 = uVar11;
            } while (uVar22 != count + 0x3f >> 6);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,count,&local_78);
          Vector::ToUnifiedFormat(vector_00,count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar25 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              psVar6 = (local_78.sel)->sel_vector;
              psVar7 = (local_c0.sel)->sel_vector;
              pdVar25 = pdVar25 + 8;
              iVar18 = 0;
              do {
                iVar12 = iVar18;
                if (psVar6 != (sel_t *)0x0) {
                  iVar12 = (idx_t)psVar6[iVar18];
                }
                iVar16 = iVar18;
                if (psVar7 != (sel_t *)0x0) {
                  iVar16 = (idx_t)psVar7[iVar18];
                }
                left_01.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_78.data + iVar12 * 0x10 + 8);
                left_01.value._0_8_ = *(undefined8 *)(local_78.data + iVar12 * 0x10);
                sVar29 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_01,
                                    *(long *)(local_c0.data + iVar16 * 8),in_R8,in_R9);
                *(long *)(pdVar25 + -8) = sVar29.value._0_8_;
                *(long *)pdVar25 = sVar29.value._8_8_;
                iVar18 = iVar18 + 1;
                pdVar25 = pdVar25 + 0x10;
              } while (count != iVar18);
            }
          }
          else if (count != 0) {
            psVar6 = (local_78.sel)->sel_vector;
            psVar7 = (local_c0.sel)->sel_vector;
            pdVar25 = pdVar25 + 8;
            uVar21 = 0;
            do {
              uVar22 = uVar21;
              if (psVar6 != (sel_t *)0x0) {
                uVar22 = (ulong)psVar6[uVar21];
              }
              uVar13 = uVar21;
              if (psVar7 != (sel_t *)0x0) {
                uVar13 = (ulong)psVar7[uVar21];
              }
              if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_78.data + uVar22 * 0x10 + 8);
                left_05.value._0_8_ = *(undefined8 *)(local_78.data + uVar22 * 0x10);
                sVar29 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,
                                    *(long *)(local_c0.data + uVar13 * 8),in_R8,in_R9);
                *(long *)(pdVar25 + -8) = sVar29.value._0_8_;
                *(long *)pdVar25 = sVar29.value._8_8_;
              }
              else {
                _Var15._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var15._M_head_impl == (unsigned_long *)0x0) {
                  local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var10 = p_Stack_d0;
                  peVar9 = local_d8;
                  local_d8 = (element_type *)0x0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar9;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var10;
                  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                     p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var15._M_head_impl =
                       (pTVar14->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var15._M_head_impl;
                }
                bVar8 = (byte)uVar21 & 0x3f;
                _Var15._M_head_impl[uVar21 >> 6] =
                     _Var15._M_head_impl[uVar21 >> 6] &
                     (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
              }
              uVar21 = uVar21 + 1;
              pdVar25 = pdVar25 + 0x10;
            } while (count != uVar21);
          }
          if (local_c0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      paVar4 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar25 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar26 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          aVar28 = paVar4->pointer;
          pdVar26 = pdVar26 + 8;
          iVar18 = 0;
          do {
            sVar29 = BinaryLambdaWrapper::
                     Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)aVar28,
                                *(long *)(pdVar25 + iVar18 * 8),in_R8,in_R9);
            *(long *)(pdVar26 + -8) = sVar29.value._0_8_;
            *(long *)pdVar26 = sVar29.value._8_8_;
            iVar18 = iVar18 + 1;
            pdVar26 = pdVar26 + 0x10;
          } while (count != iVar18);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar22 = 0;
        uVar21 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar13 = uVar21 + 0x40;
            if (count <= uVar21 + 0x40) {
              uVar13 = count;
            }
LAB_01c3cad2:
            uVar11 = uVar21;
            if (uVar21 < uVar13) {
              aVar28 = paVar4->pointer;
              pdVar27 = pdVar26 + uVar21 * 0x10 + 8;
              do {
                sVar29 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,(string_t)aVar28,
                                    *(long *)(pdVar25 + uVar21 * 8),in_R8,in_R9);
                *(long *)(pdVar27 + -8) = sVar29.value._0_8_;
                *(long *)pdVar27 = sVar29.value._8_8_;
                uVar21 = uVar21 + 1;
                pdVar27 = pdVar27 + 0x10;
                uVar11 = uVar13;
              } while (uVar13 != uVar21);
            }
          }
          else {
            uVar24 = puVar3[uVar22];
            uVar13 = uVar21 + 0x40;
            if (count <= uVar21 + 0x40) {
              uVar13 = count;
            }
            uVar11 = uVar13;
            if (uVar24 != 0) {
              if (uVar24 == 0xffffffffffffffff) goto LAB_01c3cad2;
              uVar11 = uVar21;
              if (uVar21 < uVar13) {
                pdVar27 = pdVar26 + uVar21 * 0x10 + 8;
                uVar20 = 0;
                do {
                  if ((uVar24 >> (uVar20 & 0x3f) & 1) != 0) {
                    sVar29 = BinaryLambdaWrapper::
                             Operation<duckdb::RepeatFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,long,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,(string_t)paVar4->pointer,
                                        *(long *)(pdVar25 + uVar20 * 8 + uVar21 * 8),in_R8,in_R9);
                    *(long *)(pdVar27 + -8) = sVar29.value._0_8_;
                    *(long *)pdVar27 = sVar29.value._8_8_;
                  }
                  uVar20 = uVar20 + 1;
                  pdVar27 = pdVar27 + 0x10;
                  uVar11 = uVar13;
                } while (uVar13 - uVar21 != uVar20);
              }
            }
          }
          uVar22 = uVar22 + 1;
          uVar21 = uVar11;
          if (uVar22 == count + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void RepeatFunction(DataChunk &args, ExpressionState &, Vector &result) {
	auto &str_vector = args.data[0];
	auto &cnt_vector = args.data[1];

	BinaryExecutor::Execute<string_t, int64_t, string_t>(
	    str_vector, cnt_vector, result, args.size(), [&](string_t str, int64_t cnt) {
		    auto input_str = str.GetData();
		    auto size_str = str.GetSize();
		    idx_t copy_count = cnt <= 0 || size_str == 0 ? 0 : UnsafeNumericCast<idx_t>(cnt);

		    idx_t copy_size;
		    if (TryMultiplyOperator::Operation(size_str, copy_count, copy_size)) {
			    auto result_str = StringVector::EmptyString(result, copy_size);
			    auto result_data = result_str.GetDataWriteable();
			    for (idx_t i = 0; i < copy_count; i++) {
				    memcpy(result_data + i * size_str, input_str, size_str);
			    }
			    result_str.Finalize();
			    return result_str;
		    } else {
			    throw OutOfRangeException(
			        "Cannot create a string of size: '%d' * '%d', the maximum supported string size is: '%d'", size_str,
			        copy_count, string_t::MAX_STRING_SIZE);
		    }
	    });
}